

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall
CEditor::DoQuadEnvelopes
          (CEditor *this,array<CQuad,_allocator_default<CQuad>_> *lQuads,CTextureHandle Texture)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  CQuad *pCVar7;
  CEnvelope **ppCVar8;
  IGraphics *pIVar9;
  CEnvPoint *pCVar10;
  uint in_EDX;
  array<CQuad,_allocator_default<CQuad>_> *in_RSI;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int i_3;
  int j_2;
  float Alpha;
  float Rot;
  float OffsetY;
  float OffsetX;
  int i_2;
  CPoint *pPoints_1;
  int j_1;
  float time;
  float a;
  int n;
  int Steps;
  int i_1;
  CPoint *pPoints;
  int j;
  int i;
  CEnvelope **apEnvelope;
  int Num;
  CFreeformItem Freeform;
  CLineItem Line;
  vec2 Pos1;
  vec2 Pos0;
  CColorVertex aArray [4];
  float aResults [4];
  undefined8 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  float in_stack_fffffffffffffe28;
  float in_stack_fffffffffffffe2c;
  float in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  float in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  CQuad *in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  float local_168;
  int local_124;
  int local_120;
  int local_10c;
  CQuad *local_108;
  int local_100;
  int local_f4;
  int local_ec;
  int local_e0;
  int local_dc;
  CFreeformItem local_b8;
  uint local_98;
  CLineItem local_94;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_84;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_80;
  vector2_base<float> local_7c;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_74;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_70;
  uint local_6c;
  CColorVertex local_68;
  CColorVertex CStack_54;
  undefined1 auStack_40 [40];
  float local_18;
  float local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c = in_EDX;
  iVar2 = array<CQuad,_allocator_default<CQuad>_>::size(in_RSI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  mem_zero((void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
           (uint)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  for (local_dc = 0; local_dc < iVar2; local_dc = local_dc + 1) {
    if ((((in_RDI->m_ShowEnvelopePreview == 1) &&
         (pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_dc),
         pCVar7->m_PosEnv == in_RDI->m_SelectedEnvelope)) || (in_RDI->m_ShowEnvelopePreview == 2))
       && (pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_dc),
          -1 < pCVar7->m_PosEnv)) {
      pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_dc);
      iVar4 = pCVar7->m_PosEnv;
      iVar3 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::size
                        (&(in_RDI->m_Map).m_lEnvelopes);
      if (iVar4 < iVar3) {
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_dc);
        ppCVar8 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[]
                            (&(in_RDI->m_Map).m_lEnvelopes,pCVar7->m_PosEnv);
        *(CEnvelope **)((long)pvVar6 + (long)local_dc * 8) = *ppCVar8;
      }
    }
  }
  Graphics(in_RDI);
  IGraphics::TextureClear
            ((IGraphics *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  pIVar9 = Graphics(in_RDI);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x14])();
  pIVar9 = Graphics(in_RDI);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x21])(0x3ea0a0a1,0x3f169697,0x3f66e6e7,0x3f000000);
  for (local_e0 = 0; local_e0 < iVar2; local_e0 = local_e0 + 1) {
    if (*(long *)((long)pvVar6 + (long)local_e0 * 8) != 0) {
      pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_e0);
      for (local_ec = 0;
          iVar4 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::size
                            ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                             (*(long *)((long)pvVar6 + (long)local_e0 * 8) + 8)),
          local_ec < iVar4 + -1; local_ec = local_ec + 1) {
        vector2_base<float>::vector2_base((vector2_base<float> *)&local_74,0.0,0.0);
        array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                  ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                   (*(long *)((long)pvVar6 + (long)local_e0 * 8) + 8),local_ec);
        CEnvelope::Eval((CEnvelope *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                        (float)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                        (float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        fVar12 = fx2f(pCVar7->m_aPoints[4].x);
        fVar12 = fVar12 + local_18;
        fVar13 = fx2f(pCVar7->m_aPoints[4].y);
        vector2_base<float>::vector2_base(&local_7c,fVar12,fVar13 + local_14);
        _local_74 = local_7c;
        for (local_f4 = 1; local_f4 < 0x10; local_f4 = local_f4 + 1) {
          pCVar10 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                              ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                               (*(long *)((long)pvVar6 + (long)local_e0 * 8) + 8),local_ec);
          iVar4 = (pCVar10->super_CEnvPoint_v1).m_Time;
          pCVar10 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                              ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                               (*(long *)((long)pvVar6 + (long)local_e0 * 8) + 8),local_ec + 1);
          mix<int,float>(iVar4,(pCVar10->super_CEnvPoint_v1).m_Time,(float)local_f4 / 15.0);
          CEnvelope::Eval((CEnvelope *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                          ,(float)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                          (float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          fVar12 = fx2f(pCVar7->m_aPoints[4].x);
          fVar12 = fVar12 + local_18;
          fVar13 = fx2f(pCVar7->m_aPoints[4].y);
          vector2_base<float>::vector2_base
                    ((vector2_base<float> *)&local_84,fVar12,fVar13 + local_14);
          IGraphics::CLineItem::CLineItem(&local_94,local_74.x,aStack_70.y,local_84.x,aStack_80.y);
          pIVar9 = Graphics(in_RDI);
          (*(pIVar9->super_IInterface)._vptr_IInterface[0x16])(pIVar9,&local_94,1);
          aStack_70.y = aStack_80.y;
          local_74.x = local_84.x;
        }
      }
    }
  }
  pIVar9 = Graphics(in_RDI);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
  pIVar9 = Graphics(in_RDI);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x15])();
  pIVar9 = Graphics(in_RDI);
  local_98 = local_6c;
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x13])(pIVar9,(ulong)local_6c);
  pIVar9 = Graphics(in_RDI);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x17])();
  for (local_100 = 0; local_100 < iVar2; local_100 = local_100 + 1) {
    if (*(long *)((long)pvVar6 + (long)local_100 * 8) != 0) {
      local_108 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
      for (local_10c = 0;
          iVar4 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::size
                            ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                             (*(long *)((long)pvVar6 + (long)local_100 * 8) + 8)), local_10c < iVar4
          ; local_10c = local_10c + 1) {
        pCVar10 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                            ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                             (*(long *)((long)pvVar6 + (long)local_100 * 8) + 8),local_10c);
        fVar12 = fx2f((pCVar10->super_CEnvPoint_v1).m_aValues[0]);
        pCVar10 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                            ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                             (*(long *)((long)pvVar6 + (long)local_100 * 8) + 8),local_10c);
        fVar13 = fx2f((pCVar10->super_CEnvPoint_v1).m_aValues[1]);
        pCVar10 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                            ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                             (*(long *)((long)pvVar6 + (long)local_100 * 8) + 8),local_10c);
        fVar14 = fx2f((pCVar10->super_CEnvPoint_v1).m_aValues[2]);
        fVar14 = (fVar14 / 360.0) * 3.1415927 * 2.0;
        iVar4 = in_RDI->m_SelectedQuadEnvelope;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        bVar11 = false;
        if (iVar4 == pCVar7->m_PosEnv) {
          bVar11 = in_RDI->m_SelectedEnvelopePoint == local_10c;
        }
        local_168 = 0.65;
        if (!bVar11) {
          local_168 = 0.35;
        }
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        iVar4 = pCVar7->m_aColors[0].r;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        iVar3 = pCVar7->m_aColors[0].g;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        IGraphics::CColorVertex::CColorVertex
                  (&local_68,0,(float)iVar4,(float)iVar3,(float)pCVar7->m_aColors[0].b,local_168);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe68 = (float)pCVar7->m_aColors[1].r;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe6c = (float)pCVar7->m_aColors[1].g;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        IGraphics::CColorVertex::CColorVertex
                  (&CStack_54,1,in_stack_fffffffffffffe68,in_stack_fffffffffffffe6c,
                   (float)pCVar7->m_aColors[1].b,local_168);
        in_stack_fffffffffffffe70 = (CQuad *)auStack_40;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe78 = (float)pCVar7->m_aColors[2].r;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe7c = (float)pCVar7->m_aColors[2].g;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        IGraphics::CColorVertex::CColorVertex
                  ((CColorVertex *)in_stack_fffffffffffffe70,2,in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffe7c,(float)pCVar7->m_aColors[2].b,local_168);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        iVar4 = pCVar7->m_aColors[3].r;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        iVar3 = pCVar7->m_aColors[3].g;
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        IGraphics::CColorVertex::CColorVertex
                  ((CColorVertex *)(auStack_40 + 0x14),3,(float)iVar4,(float)iVar3,
                   (float)pCVar7->m_aColors[3].b,local_168);
        pIVar9 = Graphics(in_RDI);
        (*(pIVar9->super_IInterface)._vptr_IInterface[0x20])(pIVar9,&local_68,4);
        if ((fVar14 != 0.0) || (NAN(fVar14))) {
          pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
          DoQuadEnvelopes::aRotated[0] = pCVar7->m_aPoints[0];
          pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
          DoQuadEnvelopes::aRotated[1] = pCVar7->m_aPoints[1];
          pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
          DoQuadEnvelopes::aRotated[2] = pCVar7->m_aPoints[2];
          pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
          DoQuadEnvelopes::aRotated[3] = pCVar7->m_aPoints[3];
          local_108 = (CQuad *)DoQuadEnvelopes::aRotated;
          array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
          Rotate((CPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (CPoint *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe24);
          array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
          Rotate((CPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (CPoint *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe24);
          array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
          Rotate((CPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (CPoint *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe24);
          array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
          Rotate((CPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (CPoint *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe24);
        }
        pIVar9 = Graphics(in_RDI);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        fVar14 = fx2f(pCVar7->m_aTexcoords[0].x);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        fVar15 = fx2f(pCVar7->m_aTexcoords[0].y);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe24 = fx2f(pCVar7->m_aTexcoords[1].x);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe28 = fx2f(pCVar7->m_aTexcoords[1].y);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe2c = fx2f(pCVar7->m_aTexcoords[2].x);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe30 = fx2f(pCVar7->m_aTexcoords[2].y);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        in_stack_fffffffffffffe34 = fx2f(pCVar7->m_aTexcoords[3].x);
        pCVar7 = array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_100);
        fVar16 = fx2f(pCVar7->m_aTexcoords[3].y);
        (*(pIVar9->super_IInterface)._vptr_IInterface[0x1b])
                  (fVar14,fVar15,in_stack_fffffffffffffe24,in_stack_fffffffffffffe28,
                   in_stack_fffffffffffffe2c,in_stack_fffffffffffffe30,in_stack_fffffffffffffe34,
                   fVar16,pIVar9,0xffffffff);
        fVar14 = fx2f(local_108->m_aPoints[0].x);
        fVar15 = fx2f(local_108->m_aPoints[0].y);
        fVar16 = fx2f(local_108->m_aPoints[1].x);
        fVar17 = fx2f(local_108->m_aPoints[1].y);
        fVar18 = fx2f(local_108->m_aPoints[2].x);
        fVar19 = fx2f(local_108->m_aPoints[2].y);
        fVar20 = fx2f(local_108->m_aPoints[3].x);
        fVar21 = fx2f(local_108->m_aPoints[3].y);
        IGraphics::CFreeformItem::CFreeformItem
                  (&local_b8,fVar14 + fVar12,fVar15 + fVar13,fVar16 + fVar12,fVar17 + fVar13,
                   fVar18 + fVar12,fVar19 + fVar13,fVar20 + fVar12,fVar21 + fVar13);
        pIVar9 = Graphics(in_RDI);
        (*(pIVar9->super_IInterface)._vptr_IInterface[0x1e])(pIVar9,&local_b8,1);
      }
    }
  }
  pIVar9 = Graphics(in_RDI);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x18])();
  Graphics(in_RDI);
  IGraphics::TextureClear
            ((IGraphics *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  pIVar9 = Graphics(in_RDI);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x17])();
  for (local_120 = 0; local_120 < iVar2; local_120 = local_120 + 1) {
    if (*(long *)((long)pvVar6 + (long)local_120 * 8) != 0) {
      local_124 = 0;
      while (iVar4 = local_124,
            iVar3 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::size
                              ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                               (*(long *)((long)pvVar6 + (long)local_120 * 8) + 8)), iVar4 < iVar3)
      {
        array<CQuad,_allocator_default<CQuad>_>::operator[](in_RSI,local_120);
        DoQuadEnvPoint((CEditor *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffe70,(int)in_stack_fffffffffffffe6c,
                       (int)in_stack_fffffffffffffe68);
        local_124 = local_124 + 1;
      }
    }
  }
  pIVar9 = Graphics(in_RDI);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x18])();
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoQuadEnvelopes(const array<CQuad> &lQuads, IGraphics::CTextureHandle Texture)
{
	int Num = lQuads.size();
	CEnvelope **apEnvelope = new CEnvelope*[Num];
	mem_zero(apEnvelope, sizeof(CEnvelope*)*Num);
	for(int i = 0; i < Num; i++)
	{
		if((m_ShowEnvelopePreview == SHOWENV_SELECTED && lQuads[i].m_PosEnv == m_SelectedEnvelope) || m_ShowEnvelopePreview == SHOWENV_ALL)
			if(lQuads[i].m_PosEnv >= 0 && lQuads[i].m_PosEnv < m_Map.m_lEnvelopes.size())
				apEnvelope[i] = m_Map.m_lEnvelopes[lQuads[i].m_PosEnv];
	}

	//Draw Lines
	Graphics()->TextureClear();
	Graphics()->LinesBegin();
	Graphics()->SetColor(80.0f/255, 150.0f/255, 230.f/255, 0.5f);
	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		//QuadParams
		const CPoint *pPoints = lQuads[j].m_aPoints;
		for(int i = 0; i < apEnvelope[j]->m_lPoints.size()-1; i++)
		{
			float aResults[4];
			vec2 Pos0 = vec2(0,0);

			apEnvelope[j]->Eval(apEnvelope[j]->m_lPoints[i].m_Time/1000.0f + 0.000001f, aResults);
			Pos0 = vec2(fx2f(pPoints[4].x)+aResults[0], fx2f(pPoints[4].y)+aResults[1]);

			const int Steps = 15;
			for(int n = 1; n <= Steps; n++)
			{
				float a = n/(float)Steps;

				// little offset to prevent looping due to fmod
				float time = mix(apEnvelope[j]->m_lPoints[i].m_Time, apEnvelope[j]->m_lPoints[i+1].m_Time, a);
				apEnvelope[j]->Eval(time/1000.0f - 0.000001f, aResults);

				vec2 Pos1 = vec2(fx2f(pPoints[4].x)+aResults[0], fx2f(pPoints[4].y)+aResults[1]);

				IGraphics::CLineItem Line = IGraphics::CLineItem(Pos0.x, Pos0.y, Pos1.x, Pos1.y);
				Graphics()->LinesDraw(&Line, 1);

				Pos0 = Pos1;
			}
		}
	}
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	Graphics()->LinesEnd();

	//Draw Quads
	Graphics()->TextureSet(Texture);
	Graphics()->QuadsBegin();

	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		//QuadParams
		const CPoint *pPoints = lQuads[j].m_aPoints;

		for(int i = 0; i < apEnvelope[j]->m_lPoints.size(); i++)
		{
			//Calc Env Position
			float OffsetX = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[0]);
			float OffsetY = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[1]);
			float Rot = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[2])/360.0f*pi*2;

			//Set Colors
			float Alpha = (m_SelectedQuadEnvelope == lQuads[j].m_PosEnv && m_SelectedEnvelopePoint == i) ? 0.65f : 0.35f;
			IGraphics::CColorVertex aArray[4] = {
				IGraphics::CColorVertex(0, lQuads[j].m_aColors[0].r, lQuads[j].m_aColors[0].g, lQuads[j].m_aColors[0].b, Alpha),
				IGraphics::CColorVertex(1, lQuads[j].m_aColors[1].r, lQuads[j].m_aColors[1].g, lQuads[j].m_aColors[1].b, Alpha),
				IGraphics::CColorVertex(2, lQuads[j].m_aColors[2].r, lQuads[j].m_aColors[2].g, lQuads[j].m_aColors[2].b, Alpha),
				IGraphics::CColorVertex(3, lQuads[j].m_aColors[3].r, lQuads[j].m_aColors[3].g, lQuads[j].m_aColors[3].b, Alpha)};
			Graphics()->SetColorVertex(aArray, 4);

			//Rotation
			if(Rot != 0)
			{
				static CPoint aRotated[4];
				aRotated[0] = lQuads[j].m_aPoints[0];
				aRotated[1] = lQuads[j].m_aPoints[1];
				aRotated[2] = lQuads[j].m_aPoints[2];
				aRotated[3] = lQuads[j].m_aPoints[3];
				pPoints = aRotated;

				Rotate(&lQuads[j].m_aPoints[4], &aRotated[0], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[1], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[2], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[3], Rot);
			}

			//Set Texture Coords
			Graphics()->QuadsSetSubsetFree(
				fx2f(lQuads[j].m_aTexcoords[0].x), fx2f(lQuads[j].m_aTexcoords[0].y),
				fx2f(lQuads[j].m_aTexcoords[1].x), fx2f(lQuads[j].m_aTexcoords[1].y),
				fx2f(lQuads[j].m_aTexcoords[2].x), fx2f(lQuads[j].m_aTexcoords[2].y),
				fx2f(lQuads[j].m_aTexcoords[3].x), fx2f(lQuads[j].m_aTexcoords[3].y)
			);

			//Set Quad Coords & Draw
			IGraphics::CFreeformItem Freeform(
				fx2f(pPoints[0].x)+OffsetX, fx2f(pPoints[0].y)+OffsetY,
				fx2f(pPoints[1].x)+OffsetX, fx2f(pPoints[1].y)+OffsetY,
				fx2f(pPoints[2].x)+OffsetX, fx2f(pPoints[2].y)+OffsetY,
				fx2f(pPoints[3].x)+OffsetX, fx2f(pPoints[3].y)+OffsetY);
			Graphics()->QuadsDrawFreeform(&Freeform, 1);
		}
	}
	Graphics()->QuadsEnd();
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();

	// Draw QuadPoints
	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		for(int i = 0; i < apEnvelope[j]->m_lPoints.size(); i++)
			DoQuadEnvPoint(&lQuads[j], j, i);
	}
	Graphics()->QuadsEnd();
	delete[] apEnvelope;
}